

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

void __thiscall slang::parsing::Lexer::scanIdentifier(Lexer *this)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  
  pcVar2 = this->sourceBuffer;
  do {
    cVar1 = *pcVar2;
    bVar3 = ((byte)(cVar1 + 0x9fU) < 0x1a || (byte)(cVar1 - 0x30U) < 10) ||
            (byte)(cVar1 + 0xbfU) < 0x1a;
    if (((bVar3) || (cVar1 == '_')) || (cVar1 == '$')) {
      pcVar2 = pcVar2 + 1;
      this->sourceBuffer = pcVar2;
    }
  } while (((bVar3) || (cVar1 == '$')) || (cVar1 == '_'));
  return;
}

Assistant:

void Lexer::scanIdentifier() {
    while (true) {
        char c = peek();
        if (isAlphaNumeric(c) || c == '_' || c == '$')
            advance();
        else
            return;
    }
}